

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::TextFlow::AnsiSkippingString::AnsiSkippingString(AnsiSkippingString *this,string *text)

{
  std::__cxx11::string::string((string *)this,(string *)text);
  this->m_size = 0;
  preprocessString(this);
  return;
}

Assistant:

AnsiSkippingString::AnsiSkippingString( std::string const& text ):
            m_string( text ) {
            preprocessString();
        }